

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O2

void __thiscall
boost::python::
init_base<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
::
visit<boost::python::class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (init_base<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
           *this,class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                 *cl)

{
  undefined1 local_2;
  undefined1 local_1;
  
  detail::
  def_init_aux<boost::python::class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>,boost::mpl::size<boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>>>
            (cl,&local_2,&local_1,*(undefined8 *)this,this + 8);
  return;
}

Assistant:

void visit(classT& cl) const
    {
        typedef typename DerivedT::signature signature;
        typedef typename DerivedT::n_arguments n_arguments;
        typedef typename DerivedT::n_defaults n_defaults;
    
        detail::define_class_init_helper<n_defaults::value>::apply(
            cl
          , derived().call_policies()
          , signature()
          , n_arguments()
          , derived().doc_string()
          , derived().keywords());
    }